

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O2

string * MyCompiler::visitExpression
                   (string *__return_storage_ptr__,Expression *ast,
                   vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                   *result,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *usedIdents,int *tempIdentCounter)

{
  element_type *peVar1;
  bool bVar2;
  pointer ppVar3;
  string *psVar4;
  string aTerm;
  string secondTerm;
  allocator local_109;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_108;
  int *local_100;
  pointer local_f8;
  string local_f0;
  undefined1 local_d0 [64];
  string local_90 [32];
  string local_70 [32];
  string local_50;
  
  local_108 = usedIdents;
  local_100 = tempIdentCounter;
  visitTerm(&local_f0,
            (ast->pTerm).super___shared_ptr<MyCompiler::Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
            result,usedIdents,tempIdentCounter);
  peVar1 = (ast->pAddSubOp).super___shared_ptr<MyCompiler::AddSubOp,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
LAB_00108b4a:
    ppVar3 = (ast->vAddSubOpExpression).
             super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8 = (ast->vAddSubOpExpression).
               super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (ppVar3 == local_f8) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == &local_f0.field_2) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,local_f0.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f0.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_f0._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,local_f0.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_f0._M_string_length;
      local_f0._M_string_length = 0;
      local_f0.field_2._M_local_buf[0] = '\0';
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      goto LAB_00108c8f;
    }
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    bVar2 = false;
  }
  else {
    bVar2 = std::operator==(&(peVar1->super_AbstractAstNode).value,"-");
    if (!bVar2) goto LAB_00108b4a;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    nextTempIdent((string *)local_d0,local_108,local_100);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_d0);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::string((string *)local_d0,"*",(allocator *)&local_50);
    std::__cxx11::string::string((string *)(local_d0 + 0x20),"-1",&local_109);
    std::__cxx11::string::string(local_90,(string *)&local_f0);
    std::__cxx11::string::string(local_70,(string *)__return_storage_ptr__);
    std::
    vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
    ::emplace_back<std::array<std::__cxx11::string,4ul>>
              ((vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
                *)result,
               (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                *)local_d0);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              *)local_d0);
    ppVar3 = (ast->vAddSubOpExpression).
             super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_f8 = (ast->vAddSubOpExpression).
               super__Vector_base<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>,_std::allocator<std::pair<MyCompiler::AddSubOp,_MyCompiler::Term>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
  }
  for (; ppVar3 != local_f8; ppVar3 = ppVar3 + 1) {
    visitTerm(&local_50,&ppVar3->second,result,local_108,local_100);
    if (!bVar2) {
      nextTempIdent((string *)local_d0,local_108,local_100);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_d0);
      std::__cxx11::string::~string((string *)local_d0);
    }
    std::__cxx11::string::string
              ((string *)local_d0,(string *)&(ppVar3->first).super_AbstractAstNode.value);
    psVar4 = &local_f0;
    if (bVar2) {
      psVar4 = __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)(local_d0 + 0x20),(string *)psVar4);
    std::__cxx11::string::string(local_90,(string *)&local_50);
    std::__cxx11::string::string(local_70,(string *)__return_storage_ptr__);
    std::
    vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
    ::emplace_back<std::array<std::__cxx11::string,4ul>>
              ((vector<std::array<std::__cxx11::string,4ul>,std::allocator<std::array<std::__cxx11::string,4ul>>>
                *)result,
               (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
                *)local_d0);
    std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
    ::~array((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>
              *)local_d0);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = true;
  }
LAB_00108c8f:
  std::__cxx11::string::~string((string *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::string MyCompiler::visitExpression(MyCompiler::Expression &ast,
                                        std::vector<std::array<std::string, 4>> &result,
                                        std::unordered_set<std::string> &usedIdents,
                                        int &tempIdentCounter)
{
    std::string aTerm = visitTerm(*ast.pTerm, result, usedIdents, tempIdentCounter);

    bool negative = ast.pAddSubOp != nullptr && ast.pAddSubOp->value == "-";
    if (!negative && ast.vAddSubOpExpression.empty())
        return aTerm;

    bool moreTerm = false;
    std::string temp;

    if (negative)
    {
        temp = nextTempIdent(usedIdents, tempIdentCounter);
        moreTerm = true;
        result.push_back({"*", "-1", aTerm, temp});
    }

    for (auto &item : ast.vAddSubOpExpression)
    {
        std::string secondTerm = visitTerm(item.second, result, usedIdents, tempIdentCounter);
        if (!moreTerm)
            temp = nextTempIdent(usedIdents, tempIdentCounter);
        result.push_back({item.first.value,
                          moreTerm ? temp : aTerm,
                          secondTerm,
                          temp});
        moreTerm = true;
    }

    return temp;
}